

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseQualSource
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  size_type sVar2;
  InputError *pIVar3;
  allocator local_119;
  string local_118 [39];
  undefined1 local_f1;
  string local_f0 [32];
  Pattern *local_d0;
  Pattern *p;
  string local_c0 [32];
  double local_a0;
  double b;
  string local_90 [36];
  int local_6c;
  reference pvStack_68;
  int t;
  string *tokens;
  allocator local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *nw_local;
  Node *node_local;
  NodeParser *this_local;
  
  local_28 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)nw;
  nw_local = (Network *)node;
  node_local = (Node *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (sVar2 < 3) {
    tokens._3_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    InputError::InputError(pIVar3,2,(string *)local_48);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  pvStack_68 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_28,0);
  local_6c = Utilities::findMatch(pvStack_68 + 0x20,QualSource::SourceTypeWords);
  if (local_6c < 0) {
    b._7_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_90,(string *)(pvStack_68 + 0x20));
    InputError::InputError(pIVar3,3,(string *)local_90);
    b._7_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  bVar1 = Utilities::parseNumber<double>(pvStack_68 + 0x40,&local_a0);
  if (!bVar1) {
    p._7_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_c0,(string *)(pvStack_68 + 0x40));
    InputError::InputError(pIVar3,6,(string *)local_c0);
    p._7_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  local_d0 = (Pattern *)0x0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_28);
  if (((3 < sVar2) && (bVar1 = std::operator!=(pvStack_68 + 0x60,"*"), bVar1)) &&
     (local_d0 = Network::pattern((Network *)tokenList_local,pvStack_68 + 0x60),
     local_d0 == (Pattern *)0x0)) {
    local_f1 = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_f0,(string *)(pvStack_68 + 0x60));
    InputError::InputError(pIVar3,5,(string *)local_f0);
    local_f1 = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  bVar1 = QualSource::addSource((Node *)nw_local,local_6c,local_a0,local_d0);
  if (bVar1) {
    return;
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"Node Source",&local_119);
  InputError::InputError(pIVar3,1,(string *)local_118);
  __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void NodeParser::parseQualSource(Node* node, Network* nw, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - source type keyword
    // 2 - baseline source strength
    // 3 - time pattern ID (optional)

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read source type

    int t = Utilities::findMatch(tokens[1], QualSource::SourceTypeWords);
    if (t < 0) throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    // ... read baseline source strength

    double b;
    if ( !Utilities::parseNumber(tokens[2], b) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... read optional pattern name

    Pattern* p = 0;
    if ( tokenList.size() > 3 && tokens[3] != "*")
    {
        p = nw->pattern(tokens[3]);
        if (p == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
    }

    // ... add a water quality source to the node

    if ( !QualSource::addSource(node, t, b, p) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Source");
    }
}